

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,big_decimal_fp *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  size_type sVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t __n;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  int num_zeros;
  sign_t sign;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_85 [5];
  big_decimal_fp local_80;
  char **local_70;
  undefined1 local_64 [8];
  undefined4 uStack_5c;
  char ***local_58;
  undefined8 local_50;
  undefined8 local_48;
  big_decimal_fp *local_40;
  char ***local_38;
  int *local_30;
  
  local_70 = (char **)fp->significand;
  local_80.exponent = fp->significand_size;
  local_80.significand._4_4_ = fspecs._4_4_;
  local_80.significand_size = local_80.significand._4_4_ >> 8 & 0xff;
  local_85[0] = decimal_point;
  local_80.significand = (char *)fspecs;
  if (local_80.exponent < 0) goto LAB_004d9914;
  uVar6 = (ulong)((local_80.exponent + 1) - (uint)(local_80.significand_size == 0));
  uVar7 = fp->exponent;
  local_64._0_4_ = uVar7 + local_80.exponent;
  local_80.significand._0_4_ = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_004d96b0:
    iVar3 = uVar7 + local_80.exponent + -1;
    if ((local_80.significand._4_4_ >> 0x14 & 1) == 0) {
      uVar4 = 0;
      if (local_80.exponent == 1) {
        local_85[0] = '\0';
      }
    }
    else {
      uVar4 = 0;
      if (0 < (int)((uint)local_80.significand - local_80.exponent)) {
        uVar4 = (ulong)((uint)local_80.significand - local_80.exponent);
      }
      uVar6 = uVar6 + uVar4;
    }
    iVar2 = 1 - local_64._0_4_;
    if (0 < (int)local_64._0_4_) {
      iVar2 = iVar3;
    }
    lVar11 = 2;
    if (99 < iVar2) {
      lVar11 = (ulong)(999 < iVar2) + 3;
    }
    sVar5 = (3 - (ulong)(local_85[0] == '\0')) + uVar6 + lVar11;
    stack0xffffffffffffffa0 =
         (int *)(CONCAT44(uStack_5c,local_80.significand._4_4_ >> 8) & 0xffffffff000000ff);
    local_50._0_5_ = CONCAT14(local_85[0],local_80.exponent);
    local_48 = (big_decimal_fp *)
               (CONCAT35(local_48._5_3_,
                         CONCAT14(((local_80.significand._4_4_ >> 0x10 & 1) == 0) << 5,(int)uVar4))
               | 0x4500000000);
    local_40 = (big_decimal_fp *)CONCAT44(local_40._4_4_,iVar3);
    local_58 = (char ***)local_70;
    if (specs->width < 1) {
      sVar1 = (out.container)->_M_string_length;
      std::__cxx11::string::resize((ulong)out.container,(char)sVar5 + (char)sVar1);
      pcVar9 = ((out.container)->_M_dataplus)._M_p + sVar1;
      if (((ulong)stack0xffffffffffffffa0 & 0xffffffff) != 0) {
        *pcVar9 = *(char *)((long)&basic_data<void>::signs +
                           ((ulong)stack0xffffffffffffffa0 & 0xffffffff));
        pcVar9 = pcVar9 + 1;
      }
      lVar11 = (long)(int)local_50;
      *pcVar9 = *(char *)local_58;
      if (local_50._4_1_ == '\0') {
        pcVar9 = pcVar9 + 1;
      }
      else {
        pcVar9[1] = local_50._4_1_;
        if ((int)local_50 != 1) {
          memmove(pcVar9 + 2,(char *)((long)local_58 + 1),lVar11 - 1U);
        }
        pcVar9 = pcVar9 + 2 + (lVar11 - 1U);
      }
      __n = (size_t)(int)local_48;
      pcVar10 = pcVar9;
      if (0 < (long)__n) {
        pcVar10 = pcVar9 + __n;
        memset(pcVar9,0x30,__n);
      }
      *pcVar10 = local_48._4_1_;
      write_exponent<char,char*>((int)local_40,pcVar10 + 1);
    }
    else {
      out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                      (out,specs,sVar5,sVar5,(anon_class_40_7_ef14d3db *)(local_64 + 4));
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar8 = 0x10;
      if (0 < (int)(uint)local_80.significand) {
        uVar8 = (uint)local_80.significand;
      }
      if (((int)local_64._0_4_ < -3) || ((int)uVar8 < (int)local_64._0_4_)) goto LAB_004d96b0;
    }
    if ((int)uVar7 < 0) {
      if ((int)local_64._0_4_ < 1) {
        uVar7 = -local_64._0_4_;
        local_85._1_4_ = uVar7;
        if (SBORROW4((uint)local_80.significand,uVar7) !=
            (int)((uint)local_80.significand + local_64._0_4_) < 0) {
          local_85._1_4_ = (uint)local_80.significand;
        }
        if ((int)(uint)local_80.significand < 0) {
          local_85._1_4_ = uVar7;
        }
        if (local_80.exponent != 0) {
          local_85._1_4_ = uVar7;
        }
        if ((int)local_85._1_4_ < 0) {
LAB_004d9914:
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        sVar5 = (uint)local_85._1_4_ + uVar6 + 2;
        unique0x00004e80 = &local_80.significand_size;
        local_58 = (char ***)((long)local_85 + 1);
        local_50 = &local_80.exponent;
        local_48 = &local_80;
        local_40 = (big_decimal_fp *)local_85;
        local_38 = &local_70;
        out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                        (out,specs,sVar5,sVar5,(anon_class_48_6_9afe1116 *)(local_64 + 4));
      }
      else {
        local_85._1_4_ =
             (uint)local_80.significand - local_80.exponent &
             (int)(local_80.significand._4_4_ << 0xb) >> 0x1f;
        local_38 = (char ***)((long)local_85 + 1);
        uVar4 = (ulong)(uint)local_85._1_4_;
        if ((int)local_85._1_4_ < 1) {
          uVar4 = 0;
        }
        sVar5 = uVar4 + uVar6 + 1;
        unique0x00004e80 = &local_80.significand_size;
        local_58 = &local_70;
        local_50 = &local_80.exponent;
        local_48 = (big_decimal_fp *)local_64;
        local_40 = (big_decimal_fp *)local_85;
        out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar5,sVar5,(anon_class_48_6_48d028d1 *)(local_64 + 4));
      }
    }
    else {
      sVar5 = uVar7 + uVar6;
      local_85._1_4_ = (uint)local_80.significand - local_64._0_4_;
      if ((local_80.significand._4_4_ >> 0x14 & 1) != 0) {
        if (fspecs._4_1_ != '\x02' && (int)local_85._1_4_ < 1) {
          local_85._1_4_ = 1;
        }
        if (0 < (long)(int)local_85._1_4_) {
          sVar5 = sVar5 + (long)(int)local_85._1_4_;
        }
      }
      unique0x00004e80 = &local_80.significand_size;
      local_58 = &local_70;
      local_50 = &local_80.exponent;
      local_40 = &local_80;
      local_38 = (char ***)local_85;
      local_30 = (int *)((long)local_85 + 1);
      local_48 = fp;
      out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                      (out,specs,sVar5,sVar5,(anon_class_56_7_a2a26a24 *)(local_64 + 4));
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}